

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

ShadersAndProgram __thiscall
deqp::gles3::Performance::ShaderCompilerCase::createShadersAndProgram(ShaderCompilerCase *this)

{
  ShadersAndProgram SVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  Functions *gl;
  ShaderCompilerCase *this_local;
  ShadersAndProgram result;
  long lVar7;
  
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  uVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  dVar5 = (**(code **)(lVar7 + 0x3c8))();
  (**(code **)(lVar7 + 0x10))(dVar5,uVar3);
  (**(code **)(lVar7 + 0x10))(dVar5,uVar4);
  SVar1.fragShader = uVar4;
  SVar1.vertShader = uVar3;
  SVar1.program = dVar5;
  return SVar1;
}

Assistant:

ShaderCompilerCase::ShadersAndProgram ShaderCompilerCase::createShadersAndProgram (void) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	ShadersAndProgram		result;

	result.vertShader	= gl.createShader(GL_VERTEX_SHADER);
	result.fragShader	= gl.createShader(GL_FRAGMENT_SHADER);
	result.program		= gl.createProgram();

	gl.attachShader(result.program, result.vertShader);
	gl.attachShader(result.program, result.fragShader);

	return result;
}